

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkrequest.cpp
# Opt level: O2

void __thiscall QHttpNetworkRequest::setPeerVerifyName(QHttpNetworkRequest *this,QString *peerName)

{
  QHttpNetworkRequestPrivate *pQVar1;
  
  pQVar1 = QSharedDataPointer<QHttpNetworkRequestPrivate>::operator->(&this->d);
  QString::operator=(&pQVar1->peerVerifyName,(QString *)peerName);
  return;
}

Assistant:

void QHttpNetworkRequest::setPeerVerifyName(const QString &peerName)
{
    d->peerVerifyName = peerName;
}